

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall google::protobuf::UnknownFieldSet::ClearAndFreeMemory(UnknownFieldSet *this)

{
  _Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  *this_00;
  
  if (this->fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    Clear(this);
    this_00 = &this->fields_->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ;
    if (this_00 !=
        (_Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
         *)0x0) {
      std::
      _Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ::~_Vector_base(this_00);
    }
    operator_delete(this_00,0x18);
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
  }
  return;
}

Assistant:

void UnknownFieldSet::ClearAndFreeMemory() {
  if (fields_ != NULL) {
    Clear();
    delete fields_;
    fields_ = NULL;
  }
}